

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O1

void __thiscall wasm::PassRunner::runPass(PassRunner *this,Pass *pass)

{
  int iVar1;
  const_iterator cVar2;
  
  iVar1 = (*pass->_vptr_Pass[4])(pass);
  if ((char)iVar1 != '\0') {
    __assert_fail("!pass->isFunctionParallel()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/pass.cpp"
                  ,0x3cf,"void wasm::PassRunner::runPass(Pass *)");
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->options).passesToSkip._M_h,&pass->name);
  if (cVar2.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    return;
  }
  if (pass->runner == (PassRunner *)0x0) {
    pass->runner = this;
    (*pass->_vptr_Pass[2])(pass,this->wasm);
    handleAfterEffects(this,pass,(Function *)0x0);
    return;
  }
  __assert_fail("!pass->getPassRunner()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/pass.cpp"
                ,0x3d7,"void wasm::PassRunner::runPass(Pass *)");
}

Assistant:

void PassRunner::runPass(Pass* pass) {
  assert(!pass->isFunctionParallel());

  if (options.passesToSkip.count(pass->name)) {
    return;
  }

  // Passes can only be run once and we deliberately do not clear the pass
  // runner after running the pass, so there must not already be a runner here.
  assert(!pass->getPassRunner());
  pass->setPassRunner(this);
  pass->run(wasm);
  handleAfterEffects(pass);
}